

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

int Abc_SopIsComplement(char *pSop)

{
  bool local_19;
  char *local_18;
  char *pCur;
  char *pSop_local;
  
  local_18 = pSop;
  while( true ) {
    if (*local_18 == '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                    ,0x295,"int Abc_SopIsComplement(char *)");
    }
    if (*local_18 == '\n') break;
    local_18 = local_18 + 1;
  }
  local_19 = true;
  if (local_18[-1] != '0') {
    local_19 = local_18[-1] == 'n';
  }
  return (int)local_19;
}

Assistant:

int Abc_SopIsComplement( char * pSop )
{
    char * pCur;
    for ( pCur = pSop; *pCur; pCur++ )
        if ( *pCur == '\n' )
            return (int)(*(pCur - 1) == '0' || *(pCur - 1) == 'n');
    assert( 0 );
    return 0;
}